

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleStringBuffer_writePastLimit_Test::testBody
          (TEST_SimpleStringBuffer_writePastLimit_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  undefined1 local_1038 [8];
  SimpleString str;
  undefined1 local_1020 [4];
  int i;
  SimpleStringBuffer buffer;
  TEST_SimpleStringBuffer_writePastLimit_Test *this_local;
  
  buffer.write_limit_ = (size_t)this;
  SimpleStringBuffer::SimpleStringBuffer((SimpleStringBuffer *)local_1020);
  for (str.bufferSize_._4_4_ = 0; str.bufferSize_._4_4_ < 0x2000;
      str.bufferSize_._4_4_ = str.bufferSize_._4_4_ + 1) {
    SimpleStringBuffer::add((SimpleStringBuffer *)local_1020,"h");
  }
  SimpleString::SimpleString((SimpleString *)local_1038,"h",0xfff);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString((SimpleString *)local_1038);
  pcVar3 = SimpleStringBuffer::toString((SimpleStringBuffer *)local_1020);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,pcVar2,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x24c,pTVar4);
  SimpleString::~SimpleString((SimpleString *)local_1038);
  return;
}

Assistant:

TEST(SimpleStringBuffer, writePastLimit)
{
    SimpleStringBuffer buffer;
    for (int i = 0; i < SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN * 2; i++)
        buffer.add("h");
    SimpleString str("h", SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN-1);
    STRCMP_EQUAL(str.asCharString(), buffer.toString());
}